

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.hpp
# Opt level: O0

State * __thiscall
Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
update<KalmanExamples::Robot1::OrientationMeasurement<float>,Kalman::StandardBase>
          (UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *this,
          MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
          *m,OrientationMeasurement<float> *z)

{
  Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> *noiseCov;
  State *pSVar1;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>
  local_88;
  Product<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>,_0>
  local_70;
  undefined1 local_50 [8];
  KalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_> K;
  Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> P_yy;
  OrientationMeasurement<float> y;
  SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> sigmaMeasurementPoints;
  OrientationMeasurement<float> *z_local;
  MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  *m_local;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *this_local;
  
  Eigen::Matrix<float,_1,_7,_1,_1,_7>::Matrix((Matrix<float,_1,_7,_1,_1,_7> *)&P_yy);
  UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_>::
  computeMeasurementPrediction<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
            ((UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
             2),(MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
                 *)this,(SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)m);
  Eigen::Matrix<float,_1,_1,_0,_1,_1>::Matrix
            ((Matrix<float,_1,_1,_0,_1,_1> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
             1));
  noiseCov = StandardBase<KalmanExamples::Robot1::OrientationMeasurement<float>_>::getCovariance
                       (&m->
                         super_StandardBase<KalmanExamples::Robot1::OrientationMeasurement<float>_>)
  ;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeCovarianceFromSigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (OrientationMeasurement<float> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
             2),(SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)&P_yy,
             noiseCov,(Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)
                      (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_50);
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeKalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (OrientationMeasurement<float> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
             2),(SigmaPoints<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)&P_yy,
             (Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
             1),(KalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)local_50);
  Eigen::MatrixBase<Eigen::Matrix<float,1,1,0,1,1>>::operator-
            (&local_88,(MatrixBase<Eigen::Matrix<float,1,1,0,1,1>> *)z,
             (MatrixBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
             2));
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator*
            (&local_70,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)local_50,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>_>
              *)&local_88);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)this,
             (MatrixBase<Eigen::Product<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>,_0>_>
              *)&local_70);
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  updateStateCovariance<KalmanExamples::Robot1::OrientationMeasurement<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (KalmanGain<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)local_50,
             (Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
             1));
  pSVar1 = KalmanFilterBase<KalmanExamples::Robot1::State<float>_>::getState
                     ((KalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)this);
  return pSVar1;
}

Assistant:

const State& update( const MeasurementModelType<Measurement, CovarianceBase>& m, const Measurement& z )
        {
            SigmaPoints<Measurement> sigmaMeasurementPoints;
            
            // Predict measurement (and corresponding sigma points)
            Measurement y = this->template computeMeasurementPrediction<Measurement, CovarianceBase>(m, sigmaMeasurementPoints);
            
            // Compute innovation covariance
            Covariance<Measurement> P_yy;
            computeCovarianceFromSigmaPoints(y, sigmaMeasurementPoints, m.getCovariance(), P_yy);
            
            KalmanGain<Measurement> K;
            computeKalmanGain(y, sigmaMeasurementPoints, P_yy, K);
            
            // Update state
            x += K * ( z - y );
            
            // Update state covariance
            updateStateCovariance<Measurement>(K, P_yy);
            
            return this->getState();
        }